

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quad.cpp
# Opt level: O2

void __thiscall Quad::Quad(Quad *this,Quad *quadToCopy,Vec2d *offset)

{
  Vec2d **ppVVar1;
  Vec2d *pVVar2;
  long lVar3;
  
  this->vertexCount = 0;
  this->vertices = (Vec2d **)0x0;
  this->fillColour = (Colour *)0x0;
  this->lineColour = (Colour *)0x0;
  ppVVar1 = (Vec2d **)operator_new__(0x20);
  this->vertices = ppVVar1;
  this->vertexCount = quadToCopy->vertexCount;
  this->fillColour = quadToCopy->fillColour;
  this->lineColour = quadToCopy->lineColour;
  ppVVar1 = quadToCopy->vertices;
  for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
    pVVar2 = (Vec2d *)operator_new(8);
    Vec2d::Vec2d(pVVar2,ppVVar1[lVar3]);
    pVVar2 = Vec2d::withOffset(pVVar2,offset);
    this->vertices[lVar3] = pVVar2;
  }
  return;
}

Assistant:

Quad::Quad(Quad* quadToCopy, Vec2d* offset)    {
    vertices = new Vec2d*[4];
    
    vertexCount = quadToCopy->getVertexCount();
    fillColour = quadToCopy->getFillColour();
    lineColour = quadToCopy->getLineColour();
    Vec2d** verticesToCopy = quadToCopy->getVertices();
    for (int i = 0; i < 4; i++) {
        vertices[i] = (new Vec2d(verticesToCopy[i]))->withOffset(offset);
    }
    verticesToCopy = nullptr;
    offset = nullptr;
    quadToCopy = nullptr;
}